

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ostream_suite.cpp
# Opt level: O2

void ostringstream_suite::test_view(void)

{
  void *__buf;
  undefined1 local_1d1;
  size_type local_1d0;
  pointer local_1c8;
  ostream_buffer<char,_trial::protocol::buffer::basic_ostream<char,_std::char_traits<char>,_trial::protocol::buffer::base<char>_>_>
  container;
  string input;
  ostringstream output;
  int aiStack_160 [86];
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&output);
  container.super_basic_ostream<char,_std::char_traits<char>,_trial::protocol::buffer::base<char>_>.
  super_base<char>._vptr_base = (_func_int **)&PTR__base_00106c98;
  container.super_basic_ostream<char,_std::char_traits<char>,_trial::protocol::buffer::base<char>_>.
  content = (basic_ostream<char,_std::char_traits<char>_> *)&output;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&input,"alpha",(allocator<char> *)&local_1d0);
  local_1d0 = CONCAT71(local_1d0._1_7_,*(int *)((long)aiStack_160 + *(long *)(_output + -0x18)) == 0
                      );
  local_1d1 = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("container.grow(input.size())","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/buffer/ostream_suite.cpp"
             ,0x4d,"void ostringstream_suite::test_view()",&local_1d0,&local_1d1);
  local_1d0 = input._M_string_length;
  local_1c8 = input._M_dataplus._M_p;
  trial::protocol::buffer::
  basic_ostream<char,_std::char_traits<char>,_trial::protocol::buffer::base<char>_>::write
            (&container.
              super_basic_ostream<char,_std::char_traits<char>,_trial::protocol::buffer::base<char>_>
             ,(int)&local_1d0,__buf,input._M_string_length);
  std::__cxx11::stringbuf::str();
  boost::detail::test_with_impl<boost::detail::lw_test_eq,std::__cxx11::string,std::__cxx11::string>
            ("output.str()","input",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/buffer/ostream_suite.cpp"
             ,0x4f,"void ostringstream_suite::test_view()",&local_1d0,&input);
  std::__cxx11::string::~string((string *)&local_1d0);
  std::__cxx11::string::~string((string *)&input);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&output);
  return;
}

Assistant:

void test_view()
{
    std::ostringstream output;
    ostream_buffer<char> container(output);
    std::string input = "alpha";
    TRIAL_PROTOCOL_TEST_EQUAL(container.grow(input.size()), true);
    TRIAL_PROTOCOL_TEST_NO_THROW(container.write(input));
    TRIAL_PROTOCOL_TEST_EQUAL(output.str(), input);
}